

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_innerproduct.cpp
# Opt level: O3

int test_innerproduct(Mat *a,int outch,int bias)

{
  ulong uVar1;
  int *piVar2;
  void *__ptr;
  long *plVar3;
  int iVar4;
  pointer pMVar5;
  uint_fast16_t uVar6;
  int iVar7;
  uint_fast16_t uVar8;
  ulong uVar9;
  long lVar10;
  uint i;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> weights;
  Option opt;
  int local_990;
  int iStack_98c;
  int iStack_988;
  int iStack_984;
  size_t local_980;
  Mat local_978;
  ParamDict pd;
  
  ncnn::ParamDict::ParamDict(&pd);
  ncnn::ParamDict::set(&pd,0,outch);
  ncnn::ParamDict::set(&pd,1,1);
  ncnn::ParamDict::set(&pd,2,a->w * outch * a->h * a->c);
  uVar6 = g_prng_rand_state.c;
  bVar12 = g_prng_rand_state.c != 0;
  uVar8 = g_prng_rand_state.c - 1;
  g_prng_rand_state.c = 0x36;
  if (bVar12) {
    g_prng_rand_state.c = uVar8;
  }
  uVar9 = 0;
  do {
    iVar7 = (int)g_prng_rand_state.i;
    iVar4 = (int)uVar9;
    uVar11 = g_prng_rand_state.s[iVar7 + iVar4 + 9U & 0x3f] +
             g_prng_rand_state.s[iVar7 + iVar4 + 0x28U & 0x3f];
    uVar1 = uVar9 + 1;
    g_prng_rand_state.s[iVar7 + iVar4 & 0x3f] = uVar11;
    if (uVar6 != 0) break;
    bVar12 = uVar9 < 0x1ef;
    uVar9 = uVar1;
  } while (bVar12);
  g_prng_rand_state.i = g_prng_rand_state.i + uVar1;
  i = (int)uVar11 + (int)(uVar11 / 5) * -5;
  local_978.data = (void *)0x0;
  local_978.refcount = (int *)0x0;
  local_978.elemsize = 4;
  local_978.elempack = 1;
  local_978.allocator = (Allocator *)0x0;
  local_978.dims = 1;
  local_978.w = 2;
  local_978.h = 1;
  local_978.c = 1;
  local_978.cstep = 2;
  opt.lightmode = false;
  opt._1_3_ = 0;
  opt.num_threads = 0;
  iVar7 = posix_memalign((void **)&opt,0x10,0xc);
  local_978.data = (float *)0x0;
  if (iVar7 == 0) {
    local_978.data = (void *)opt._0_8_;
  }
  local_978.refcount = (int *)((long)local_978.data + 8);
  *(float *)((long)local_978.data + 8) = 1.4013e-45;
  fVar13 = RandomFloat(-1.0,0.0);
  *(float *)local_978.data = fVar13;
  fVar13 = RandomFloat(0.0,1.0);
  *(float *)((long)local_978.data + 4) = fVar13;
  ncnn::ParamDict::set(&pd,9,i);
  ncnn::ParamDict::set(&pd,10,&local_978);
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x80);
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_finish = weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start + 2;
  *(undefined8 *)
   ((long)&(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start)->refcount + 4) = 0;
  *(undefined8 *)
   ((long)&(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start)->elemsize + 4) = 0;
  (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start)->data = (void *)0x0;
  (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start)->refcount = (int *)0x0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start[1].allocator = (Allocator *)0x0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start[1].dims = 0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start[1].w = 0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start[1].h = 0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start[1].c = 0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start[1].cstep = 0;
  (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start)->allocator = (Allocator *)0x0;
  (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start)->dims = 0;
  (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start)->w = 0;
  (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start)->h = 0;
  (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start)->c = 0;
  (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data
  ._M_start)->cstep = 0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start[1].data = (void *)0x0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_start[1].refcount = (int *)0x0;
  *(undefined8 *)
   ((long)&weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start[1].refcount + 4) = 0;
  *(undefined8 *)
   ((long)&weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start[1].elemsize + 4) = 0;
  weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
       super__Vector_impl_data._M_finish;
  RandomMat((Mat *)&opt,a->w * outch * a->h * a->c);
  pMVar5 = weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start != (Mat *)&opt) {
    if (opt.blob_allocator != (Allocator *)0x0) {
      LOCK();
      *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + 1;
      UNLOCK();
    }
    piVar2 = (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start)->refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if ((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
          if ((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start)->data != (void *)0x0) {
            free((weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start)->data);
          }
        }
        else {
          (**(code **)(*(long *)(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->allocator + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&pMVar5->refcount + 4) = 0;
    *(undefined8 *)((long)&pMVar5->elemsize + 4) = 0;
    pMVar5->data = (void *)0x0;
    pMVar5->refcount = (int *)0x0;
    pMVar5->dims = 0;
    pMVar5->w = 0;
    pMVar5->h = 0;
    pMVar5->c = 0;
    pMVar5->cstep = 0;
    pMVar5->data = (void *)opt._0_8_;
    pMVar5->refcount = (int *)opt.blob_allocator;
    pMVar5->elemsize = (size_t)opt.workspace_allocator;
    pMVar5->elempack = opt._24_4_;
    pMVar5->allocator = (Allocator *)opt._32_8_;
    pMVar5->dims = local_990;
    pMVar5->w = iStack_98c;
    pMVar5->h = iStack_988;
    pMVar5->c = iStack_984;
    pMVar5->cstep = local_980;
  }
  if (opt.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + -1;
    UNLOCK();
    if (*(int *)opt.blob_allocator == 0) {
      if (opt._32_8_ == 0) {
        if (opt._0_8_ != 0) {
          free((void *)opt._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)opt._32_8_ + 0x18))();
      }
    }
  }
  RandomMat((Mat *)&opt,outch);
  pMVar5 = weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start + 1 != (Mat *)&opt) {
    if (opt.blob_allocator != (Allocator *)0x0) {
      LOCK();
      *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + 1;
      UNLOCK();
    }
    piVar2 = weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start[1].refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
          if (weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
              super__Vector_impl_data._M_start[1].data != (void *)0x0) {
            free(weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start[1].data);
          }
        }
        else {
          (**(code **)(*(long *)weights.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_start[1].allocator + 0x18))();
        }
      }
    }
    pMVar5[1].data = (void *)opt._0_8_;
    pMVar5[1].refcount = (int *)opt.blob_allocator;
    pMVar5[1].elemsize = (size_t)opt.workspace_allocator;
    pMVar5[1].elempack = opt._24_4_;
    pMVar5[1].allocator = (Allocator *)opt._32_8_;
    pMVar5[1].dims = local_990;
    pMVar5[1].w = iStack_98c;
    pMVar5[1].h = iStack_988;
    pMVar5[1].c = iStack_984;
    pMVar5[1].cstep = local_980;
  }
  if (opt.blob_allocator != (Allocator *)0x0) {
    LOCK();
    *(int *)opt.blob_allocator = *(int *)opt.blob_allocator + -1;
    UNLOCK();
    if (*(int *)opt.blob_allocator == 0) {
      if (opt._32_8_ == 0) {
        if (opt._0_8_ != 0) {
          free((void *)opt._0_8_);
        }
      }
      else {
        (**(code **)(*(long *)opt._32_8_ + 0x18))();
      }
    }
  }
  ncnn::Option::Option(&opt);
  opt.num_threads = 1;
  opt.use_int8_inference = false;
  opt.use_vulkan_compute = true;
  iVar7 = test_layer<ncnn::InnerProduct>
                    ("InnerProduct",&pd,&weights,&opt,a,0.001,(_func_void_InnerProduct_ptr *)0x0);
  if (iVar7 != 0) {
    fprintf(_stderr,
            "test_innerproduct failed a.dims=%d a=(%d %d %d) outch=%d bias=%d act=%d actparams=[%f,%f]\n"
            ,SUB84((double)*local_978.data,0),(double)*(float *)((long)local_978.data + 4),
            (ulong)(uint)a->dims,(ulong)(uint)a->w,(ulong)(uint)a->h,(ulong)(uint)a->c,
            (ulong)(uint)outch,1,(ulong)i);
  }
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&weights);
  if ((float *)local_978.refcount != (float *)0x0) {
    LOCK();
    *local_978.refcount = *local_978.refcount + -1;
    UNLOCK();
    if ((float)*local_978.refcount == 0.0) {
      if (local_978.allocator == (Allocator *)0x0) {
        if ((float *)local_978.data != (float *)0x0) {
          free(local_978.data);
        }
      }
      else {
        (**(code **)(*(long *)local_978.allocator + 0x18))();
      }
    }
  }
  lVar10 = 0x8c0;
  do {
    piVar2 = *(int **)((long)&pd.params[0].v.data + lVar10);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        __ptr = *(void **)((long)&pd.params[0].type + lVar10);
        plVar3 = *(long **)((long)&pd.params[0].v.elempack + lVar10);
        if (plVar3 == (long *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*plVar3 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&pd.params[0].v.data + lVar10 + 4) = 0;
    *(undefined8 *)((long)&pd.params[0].v.refcount + lVar10 + 4) = 0;
    *(undefined8 *)((long)&pd.params[0].type + lVar10) = 0;
    *(undefined8 *)((long)&pd.params[0].v.data + lVar10) = 0;
    *(undefined8 *)((long)&pd.params[0].v.allocator + lVar10) = 0;
    *(undefined8 *)((long)&pd.params[0].v.dims + lVar10) = 0;
    *(undefined8 *)((long)&pd.params[0].v.h + lVar10) = 0;
    lVar10 = lVar10 + -0x48;
  } while (lVar10 != -0x40);
  return iVar7;
}

Assistant:

static int test_innerproduct(const ncnn::Mat& a, int outch, int bias)
{
    ncnn::ParamDict pd;
    pd.set(0, outch);// num_output
    pd.set(1, bias);// bias_term
    pd.set(2, outch*a.w*a.h*a.c);

    int activation_type = RAND() % 5;// 0 1 2 3 4
    ncnn::Mat activation_params(2);
    activation_params[0] = RandomFloat(-1, 0);// alpha
    activation_params[1] = RandomFloat(0, 1);// beta
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    std::vector<ncnn::Mat> weights(bias ? 2 : 1);
    weights[0] = RandomMat(outch*a.w*a.h*a.c);
    if (bias)
        weights[1] = RandomMat(outch);

    ncnn::Option opt;
    opt.num_threads = 1;
    opt.use_vulkan_compute = true;
    opt.use_int8_inference = false;

    int ret = test_layer<ncnn::InnerProduct>("InnerProduct", pd, weights, opt, a);
    if (ret != 0)
    {
        fprintf(stderr, "test_innerproduct failed a.dims=%d a=(%d %d %d) outch=%d bias=%d act=%d actparams=[%f,%f]\n", a.dims, a.w, a.h, a.c, outch, bias, activation_type, activation_params[0], activation_params[1]);
    }

    return ret;
}